

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * __thiscall CMU462::Matrix4x4::T(Matrix4x4 *this)

{
  double *pdVar1;
  Matrix4x4 *in_RDI;
  int j;
  int i;
  Matrix4x4 *A;
  Matrix4x4 *B;
  double in_stack_ffffffffffffffc8;
  Matrix4x4 *this_00;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  
  this_00 = in_RDI;
  Matrix4x4((Matrix4x4 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
    for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
      pdVar1 = operator()(this_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                          SUB84(in_stack_ffffffffffffffc8,0));
      in_stack_ffffffffffffffc8 = *pdVar1;
      pdVar1 = operator()(this_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                          SUB84(in_stack_ffffffffffffffc8,0));
      *pdVar1 = in_stack_ffffffffffffffc8;
    }
  }
  return in_RDI;
}

Assistant:

Matrix4x4 Matrix4x4::T( void ) const {
    const Matrix4x4& A( *this );
    Matrix4x4 B;

    for( int i = 0; i < 4; i++ )
    for( int j = 0; j < 4; j++ )
    {
       B(i,j) = A(j,i);
    }

    return B;
  }